

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

word If_Dec6MinimumBase(word uTruth,int *pSupp,int nVarsAll,int *pnVars)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  word *pwVar8;
  word *pwVar9;
  
  if (6 < nVarsAll) {
    __assert_fail("nVarsAll <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec07.c"
                  ,0x203,"word If_Dec6MinimumBase(word, int *, int, int *)");
  }
  if (nVarsAll < 1) {
    iVar7 = 0;
    uVar3 = 0;
  }
  else {
    uVar5 = 0;
    pwVar8 = Truth6;
    uVar3 = 0;
    iVar7 = 0;
    do {
      uVar6 = 1 << ((byte)uVar5 & 0x1f);
      if ((*pwVar8 & uTruth) >> ((byte)uVar6 & 0x3f) != (~*pwVar8 & uTruth)) {
        if (pSupp != (int *)0x0) {
          pSupp[iVar7] = pSupp[uVar5];
        }
        uVar3 = uVar3 | uVar6;
        iVar7 = iVar7 + 1;
      }
      uVar5 = uVar5 + 1;
      pwVar8 = pwVar8 + 1;
    } while ((uint)nVarsAll != uVar5);
  }
  if (pnVars != (int *)0x0) {
    *pnVars = iVar7;
  }
  if ((uVar3 + 1 & uVar3) != 0) {
    if (nVarsAll < 1) {
      iVar4 = 0;
    }
    else {
      uVar5 = 0;
      pwVar8 = Truth7[6] + 1;
      iVar4 = 0;
      do {
        uVar6 = (uint)uVar5;
        if ((uVar3 >> (uVar6 & 0x1f) & 1) != 0) {
          if (iVar4 < (int)uVar6) {
            if (5 < uVar6) {
              __assert_fail("v < 5",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec07.c"
                            ,0xea,"word If_Dec6SwapAdjacent(word, int)");
            }
            uVar1 = uVar5;
            pwVar9 = pwVar8;
            do {
              uVar1 = uVar1 - 1;
              bVar2 = (byte)(1 << ((byte)uVar1 & 0x1f));
              uTruth = (uTruth & *pwVar9) >> (bVar2 & 0x3f) |
                       ((*(word (*) [2])(pwVar9 + -1))[0] & uTruth) << (bVar2 & 0x3f) |
                       pwVar9[-2] & uTruth;
              pwVar9 = pwVar9 + -3;
            } while ((long)iVar4 < (long)uVar1);
          }
          iVar4 = iVar4 + 1;
        }
        uVar5 = uVar5 + 1;
        pwVar8 = pwVar8 + 3;
      } while (uVar5 != (uint)nVarsAll);
    }
    if (iVar4 != iVar7) {
      __assert_fail("Var == nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec07.c"
                    ,0x1fd,"word If_Dec6TruthShrink(word, int, int, unsigned int)");
    }
  }
  return uTruth;
}

Assistant:

word If_Dec6MinimumBase( word uTruth, int * pSupp, int nVarsAll, int * pnVars )
{
    int v, iVar = 0, uSupp = 0;
    assert( nVarsAll <= 6 );
    for ( v = 0; v < nVarsAll; v++ )
        if ( If_Dec6HasVar( uTruth, v ) )
        {
            uSupp |= (1 << v);
            if ( pSupp )
                pSupp[iVar] = pSupp[v];
            iVar++;
        }
    if ( pnVars )
        *pnVars = iVar;
    if ( If_DecSuppIsMinBase( uSupp ) )
        return uTruth;
    return If_Dec6TruthShrink( uTruth, iVar, nVarsAll, uSupp );
}